

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

bool __thiscall
GlobOpt::PreparePropertySymOpndForTypeCheckSeq
          (GlobOpt *this,PropertySymOpnd *propertySymOpnd,Instr *instr,Loop *loop)

{
  ObjTypeSpecFldInfo *this_00;
  bool bVar1;
  EquivalentTypeSet *pEVar2;
  PropertySym *propertySym;
  
  bVar1 = DoObjTypeSpec(this,loop);
  if ((bVar1) && (bVar1 = OpCodeAttr::FastFldInstr(instr->m_opcode), bVar1)) {
    bVar1 = IR::Instr::CallsAccessor(instr,(PropertySymOpnd *)0x0);
    if (bVar1) {
      return false;
    }
    this_00 = propertySymOpnd->objTypeSpecFldInfo;
    if ((((this_00 != (ObjTypeSpecFldInfo *)0x0) &&
         (bVar1 = ObjTypeSpecFldInfo::UsesAccessor(this_00), !bVar1)) &&
        (bVar1 = ObjTypeSpecFldInfo::IsRootObjectNonConfigurableFieldLoad(this_00), !bVar1)) &&
       ((bVar1 = ObjTypeSpecFldInfo::IsPoly(this_00), !bVar1 ||
        (pEVar2 = ObjTypeSpecFldInfo::GetEquivalentTypeSet(this_00),
        pEVar2 != (EquivalentTypeSet *)0x0)))) {
      propertySym = Sym::AsPropertySym((propertySymOpnd->super_SymOpnd).m_sym);
      PreparePropertySymForTypeCheckSeq(this,propertySym);
      IR::PropertySymOpnd::SetTypeCheckSeqCandidate(propertySymOpnd,true);
      IR::PropertySymOpnd::SetIsBeingStored
                (propertySymOpnd,(PropertySymOpnd *)instr->m_dst == propertySymOpnd);
      return true;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::PreparePropertySymOpndForTypeCheckSeq(IR::PropertySymOpnd * propertySymOpnd, IR::Instr* instr, Loop * loop)
{
    if (!DoFieldRefOpts(loop) || !OpCodeAttr::FastFldInstr(instr->m_opcode) || instr->CallsAccessor())
    {
        return false;
    }

    if (!propertySymOpnd->HasObjTypeSpecFldInfo())
    {
        return false;
    }

    ObjTypeSpecFldInfo* info = propertySymOpnd->GetObjTypeSpecInfo();

    if (info->UsesAccessor() || info->IsRootObjectNonConfigurableFieldLoad())
    {
        return false;
    }

    if (info->IsPoly() && !info->GetEquivalentTypeSet())
    {
        return false;
    }

    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();

    PreparePropertySymForTypeCheckSeq(propertySym);
    propertySymOpnd->SetTypeCheckSeqCandidate(true);
    propertySymOpnd->SetIsBeingStored(propertySymOpnd == instr->GetDst());

    return true;
}